

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address.c
# Opt level: O0

_Bool fnet_str2addr(char *str,fnet_address_t *addr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  addrinfo *paVar7;
  undefined8 uStack_e0;
  char acStack_d8 [8];
  fnet_address_t *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b0;
  fnet_address_t *local_a8;
  sockaddr_in6 *dst_addr_1;
  sockaddr_in6 *src_addr_1;
  sockaddr_in *dst_addr;
  sockaddr_in *src_addr;
  addrinfo *ptr;
  undefined1 local_78 [3];
  _Bool ret;
  int local_74;
  addrinfo hints;
  addrinfo *result;
  char *port;
  unsigned_long __vla_expr0;
  size_t len;
  fnet_address_t *addr_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (addr == (fnet_address_t *)0x0)) {
    str_local._7_1_ = false;
  }
  else {
    uStack_e0 = 0x102dc3;
    sVar6 = strlen(str);
    if (sVar6 < 0x401) {
      local_c8 = 0;
      uStack_c0 = 0;
      addr->__ss_padding[0x6e] = '\0';
      addr->__ss_padding[0x6f] = '\0';
      addr->__ss_padding[0x70] = '\0';
      addr->__ss_padding[0x71] = '\0';
      addr->__ss_padding[0x72] = '\0';
      addr->__ss_padding[0x73] = '\0';
      addr->__ss_padding[0x74] = '\0';
      addr->__ss_padding[0x75] = '\0';
      addr->__ss_align = 0;
      addr->__ss_padding[0x5e] = '\0';
      addr->__ss_padding[0x5f] = '\0';
      addr->__ss_padding[0x60] = '\0';
      addr->__ss_padding[0x61] = '\0';
      addr->__ss_padding[0x62] = '\0';
      addr->__ss_padding[99] = '\0';
      addr->__ss_padding[100] = '\0';
      addr->__ss_padding[0x65] = '\0';
      addr->__ss_padding[0x66] = '\0';
      addr->__ss_padding[0x67] = '\0';
      addr->__ss_padding[0x68] = '\0';
      addr->__ss_padding[0x69] = '\0';
      addr->__ss_padding[0x6a] = '\0';
      addr->__ss_padding[0x6b] = '\0';
      addr->__ss_padding[0x6c] = '\0';
      addr->__ss_padding[0x6d] = '\0';
      addr->__ss_padding[0x4e] = '\0';
      addr->__ss_padding[0x4f] = '\0';
      addr->__ss_padding[0x50] = '\0';
      addr->__ss_padding[0x51] = '\0';
      addr->__ss_padding[0x52] = '\0';
      addr->__ss_padding[0x53] = '\0';
      addr->__ss_padding[0x54] = '\0';
      addr->__ss_padding[0x55] = '\0';
      addr->__ss_padding[0x56] = '\0';
      addr->__ss_padding[0x57] = '\0';
      addr->__ss_padding[0x58] = '\0';
      addr->__ss_padding[0x59] = '\0';
      addr->__ss_padding[0x5a] = '\0';
      addr->__ss_padding[0x5b] = '\0';
      addr->__ss_padding[0x5c] = '\0';
      addr->__ss_padding[0x5d] = '\0';
      addr->__ss_padding[0x3e] = '\0';
      addr->__ss_padding[0x3f] = '\0';
      addr->__ss_padding[0x40] = '\0';
      addr->__ss_padding[0x41] = '\0';
      addr->__ss_padding[0x42] = '\0';
      addr->__ss_padding[0x43] = '\0';
      addr->__ss_padding[0x44] = '\0';
      addr->__ss_padding[0x45] = '\0';
      addr->__ss_padding[0x46] = '\0';
      addr->__ss_padding[0x47] = '\0';
      addr->__ss_padding[0x48] = '\0';
      addr->__ss_padding[0x49] = '\0';
      addr->__ss_padding[0x4a] = '\0';
      addr->__ss_padding[0x4b] = '\0';
      addr->__ss_padding[0x4c] = '\0';
      addr->__ss_padding[0x4d] = '\0';
      addr->__ss_padding[0x2e] = '\0';
      addr->__ss_padding[0x2f] = '\0';
      addr->__ss_padding[0x30] = '\0';
      addr->__ss_padding[0x31] = '\0';
      addr->__ss_padding[0x32] = '\0';
      addr->__ss_padding[0x33] = '\0';
      addr->__ss_padding[0x34] = '\0';
      addr->__ss_padding[0x35] = '\0';
      addr->__ss_padding[0x36] = '\0';
      addr->__ss_padding[0x37] = '\0';
      addr->__ss_padding[0x38] = '\0';
      addr->__ss_padding[0x39] = '\0';
      addr->__ss_padding[0x3a] = '\0';
      addr->__ss_padding[0x3b] = '\0';
      addr->__ss_padding[0x3c] = '\0';
      addr->__ss_padding[0x3d] = '\0';
      addr->__ss_padding[0x1e] = '\0';
      addr->__ss_padding[0x1f] = '\0';
      addr->__ss_padding[0x20] = '\0';
      addr->__ss_padding[0x21] = '\0';
      addr->__ss_padding[0x22] = '\0';
      addr->__ss_padding[0x23] = '\0';
      addr->__ss_padding[0x24] = '\0';
      addr->__ss_padding[0x25] = '\0';
      addr->__ss_padding[0x26] = '\0';
      addr->__ss_padding[0x27] = '\0';
      addr->__ss_padding[0x28] = '\0';
      addr->__ss_padding[0x29] = '\0';
      addr->__ss_padding[0x2a] = '\0';
      addr->__ss_padding[0x2b] = '\0';
      addr->__ss_padding[0x2c] = '\0';
      addr->__ss_padding[0x2d] = '\0';
      addr->__ss_padding[0xe] = '\0';
      addr->__ss_padding[0xf] = '\0';
      addr->__ss_padding[0x10] = '\0';
      addr->__ss_padding[0x11] = '\0';
      addr->__ss_padding[0x12] = '\0';
      addr->__ss_padding[0x13] = '\0';
      addr->__ss_padding[0x14] = '\0';
      addr->__ss_padding[0x15] = '\0';
      addr->__ss_padding[0x16] = '\0';
      addr->__ss_padding[0x17] = '\0';
      addr->__ss_padding[0x18] = '\0';
      addr->__ss_padding[0x19] = '\0';
      addr->__ss_padding[0x1a] = '\0';
      addr->__ss_padding[0x1b] = '\0';
      addr->__ss_padding[0x1c] = '\0';
      addr->__ss_padding[0x1d] = '\0';
      addr->ss_family = 0;
      addr->__ss_padding[0] = '\0';
      addr->__ss_padding[1] = '\0';
      addr->__ss_padding[2] = '\0';
      addr->__ss_padding[3] = '\0';
      addr->__ss_padding[4] = '\0';
      addr->__ss_padding[5] = '\0';
      addr->__ss_padding[6] = '\0';
      addr->__ss_padding[7] = '\0';
      addr->__ss_padding[8] = '\0';
      addr->__ss_padding[9] = '\0';
      addr->__ss_padding[10] = '\0';
      addr->__ss_padding[0xb] = '\0';
      addr->__ss_padding[0xc] = '\0';
      addr->__ss_padding[0xd] = '\0';
      lVar3 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
      local_d0 = addr;
      local_b0 = acStack_d8 + lVar3;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x102e4c;
      strncpy(acStack_d8 + lVar3,str,sVar6 + 1);
      pcVar4 = local_b0;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x102e5d;
      paVar7 = (addrinfo *)strrchr(pcVar4,0x3a);
      result = paVar7;
      if (paVar7 != (addrinfo *)0x0) {
        result = (addrinfo *)((long)&paVar7->ai_flags + 1);
        *(char *)&paVar7->ai_flags = '\0';
      }
      hints.ai_next = (addrinfo *)0x0;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x102e92;
      memset(local_78,0,0x30);
      pcVar4 = local_b0;
      local_74 = 0;
      hints.ai_flags = 1;
      hints.ai_family = 6;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x102ebf;
      iVar5 = getaddrinfo(pcVar4,(char *)result,(addrinfo *)local_78,(addrinfo **)&hints.ai_next);
      paVar7 = hints.ai_next;
      if (iVar5 == 0) {
        ptr._3_1_ = 0;
        for (src_addr = (sockaddr_in *)hints.ai_next; src_addr != (sockaddr_in *)0x0;
            src_addr = *(sockaddr_in **)src_addr[2].sin_zero) {
          if ((src_addr->sin_addr).s_addr == 2) {
            dst_addr = *(sockaddr_in **)src_addr[1].sin_zero;
            uVar1._0_2_ = dst_addr->sin_family;
            uVar1._2_2_ = dst_addr->sin_port;
            uVar1._4_4_ = dst_addr->sin_addr;
            addr->ss_family = (undefined2)uVar1;
            addr->__ss_padding[0] = (char)((ulong)uVar1 >> 0x10);
            addr->__ss_padding[1] = (char)((ulong)uVar1 >> 0x18);
            addr->__ss_padding[2] = (char)((ulong)uVar1 >> 0x20);
            addr->__ss_padding[3] = (char)((ulong)uVar1 >> 0x28);
            addr->__ss_padding[4] = (char)((ulong)uVar1 >> 0x30);
            addr->__ss_padding[5] = (char)((ulong)uVar1 >> 0x38);
            *(undefined8 *)(addr->__ss_padding + 6) = *(undefined8 *)dst_addr->sin_zero;
            ptr._3_1_ = 1;
            src_addr_1 = (sockaddr_in6 *)addr;
            break;
          }
          if ((addr->ss_family == 0) && ((src_addr->sin_addr).s_addr == 10)) {
            dst_addr_1 = *(sockaddr_in6 **)src_addr[1].sin_zero;
            uVar2._0_2_ = dst_addr_1->sin6_family;
            uVar2._2_2_ = dst_addr_1->sin6_port;
            uVar2._4_4_ = dst_addr_1->sin6_flowinfo;
            addr->ss_family = (undefined2)uVar2;
            addr->__ss_padding[0] = (char)((ulong)uVar2 >> 0x10);
            addr->__ss_padding[1] = (char)((ulong)uVar2 >> 0x18);
            addr->__ss_padding[2] = (char)((ulong)uVar2 >> 0x20);
            addr->__ss_padding[3] = (char)((ulong)uVar2 >> 0x28);
            addr->__ss_padding[4] = (char)((ulong)uVar2 >> 0x30);
            addr->__ss_padding[5] = (char)((ulong)uVar2 >> 0x38);
            *(undefined8 *)(addr->__ss_padding + 6) =
                 *(undefined8 *)&(dst_addr_1->sin6_addr).__in6_u;
            *(undefined8 *)(addr->__ss_padding + 0xe) =
                 *(undefined8 *)((long)&(dst_addr_1->sin6_addr).__in6_u + 8);
            *(uint32_t *)(addr->__ss_padding + 0x16) = dst_addr_1->sin6_scope_id;
            ptr._3_1_ = 1;
            local_a8 = addr;
          }
        }
        *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x102fab;
        freeaddrinfo((addrinfo *)paVar7);
        str_local._7_1_ = (_Bool)(ptr._3_1_ & 1);
      }
      else {
        str_local._7_1_ = false;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

bool fnet_str2addr(char const *str, fnet_address_t *addr)
{
    if (!str || !addr)
    {
        FLOG_ERR("Invalid argument");
        return false;
    }

    size_t const len = strlen(str);
    if (len > FMAX_ADDR)
    {
        FLOG_ERR("Address length is too long");
        return false;
    }

    memset(addr, 0, sizeof *addr);

    char host[len + 1];
    strncpy(host, str, len + 1);

    char *port = strrchr(host, ':');
    if (port) *(port++) = 0;

    struct addrinfo *result = 0;
    struct addrinfo hints = { 0 };
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_protocol = IPPROTO_TCP;

    if (getaddrinfo(host, port, &hints, &result))
    {
        FLOG_ERR("getaddrinfo failed");
        return false;
    }

    bool ret = false;

    for(struct addrinfo *ptr = result; ptr; ptr = ptr->ai_next)
    {
        if (ptr->ai_family == AF_INET)
        {
            struct sockaddr_in *src_addr = (struct sockaddr_in*)ptr->ai_addr;
            struct sockaddr_in *dst_addr = (struct sockaddr_in*)addr;
            memcpy(dst_addr, src_addr, sizeof *src_addr);
            ret = true;
            break;
        }
        else if (!addr->ss_family && ptr->ai_family == AF_INET6)
        {
            struct sockaddr_in6 *src_addr = (struct sockaddr_in6*)ptr->ai_addr;
            struct sockaddr_in6 *dst_addr = (struct sockaddr_in6*)addr;
            memcpy(dst_addr, src_addr, sizeof *src_addr);
            ret = true;
        }
    }

    freeaddrinfo(result);

    return ret;
}